

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *lhs;
  int vert_start_idx_00;
  int vert_end_idx_00;
  ImDrawList *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  float fVar5;
  float _x;
  float fVar6;
  float _x_00;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_4a8;
  float local_40c;
  float local_3f0;
  float local_3e8;
  byte local_3d9;
  float local_3d8;
  float local_3d4;
  float local_3cc;
  float local_3c4;
  float local_3bc;
  float local_3a8;
  byte local_371;
  uint local_370;
  uint local_36c;
  ImVec2 local_368;
  ImVec2 local_360;
  ImVec2 local_358;
  ImVec2 local_350;
  float local_344;
  ImVec2 IStack_340;
  float bar1_line_y;
  ImVec2 local_338;
  ImVec2 local_330;
  undefined1 local_328 [8];
  ImRect bar1_bb;
  float alpha;
  float sv_cursor_rad;
  ImVec2 local_308;
  ImVec2 local_300;
  ImVec2 local_2f8;
  float local_2f0;
  float bar0_line_y;
  ImVec2 local_2e4;
  int local_2dc;
  int i;
  ImVec2 local_2d0;
  ImVec2 local_2c8;
  ImVec2 local_2c0;
  ImVec2 local_2b8;
  ImVec2 local_2b0;
  ImVec2 local_2a8;
  ImVec2 local_2a0;
  ImVec2 local_298;
  ImVec2 local_290;
  ImVec2 uv_white;
  ImVec2 local_280;
  ImVec2 trc;
  ImVec2 local_270;
  ImVec2 trb;
  ImVec2 local_260;
  ImVec2 tra;
  int hue_cursor_segments;
  float hue_cursor_rad;
  ImVec2 hue_cursor_pos;
  float sin_hue_angle_1;
  float cos_hue_angle_1;
  ImVec2 local_22c;
  ImVec2 gradient_p1;
  ImVec2 gradient_p0;
  int vert_end_idx;
  int vert_start_idx;
  float a1;
  float a0;
  int n;
  int segment_per_arc;
  float aeps;
  ImVec2 sv_cursor_pos;
  ImU32 hue_colors [7];
  ImVec4 local_1d4;
  ImU32 local_1c4;
  ImU32 local_1c0;
  ImU32 col32_no_alpha;
  ImU32 hue_color32;
  ImVec4 hue_color_f;
  float new_V;
  float new_S;
  float new_H;
  ImGuiColorEditFlags sub_flags;
  ImGuiColorEditFlags sub_flags_to_forward_1;
  bool value_changed_fix_hue_wrap;
  undefined1 local_18c [8];
  ImVec4 ref_col_v4;
  undefined1 local_170 [4];
  ImGuiColorEditFlags sub_flags_to_forward;
  ImVec4 col_v4;
  char *label_display_end;
  ImVec2 local_14c;
  ImVec2 local_144;
  ImVec2 local_13c;
  ImVec2 local_134;
  float local_12c;
  float local_128;
  float ww;
  float vv;
  float uu;
  ImVec2 local_118;
  ImVec2 current_off_unrotated;
  float sin_hue_angle;
  float cos_hue_angle;
  float initial_dist2;
  ImVec2 current_off;
  ImVec2 initial_off;
  bool local_e3;
  bool local_e2;
  bool local_e1;
  float local_e0;
  bool value_changed_sv;
  bool value_changed_h;
  float fStack_dc;
  bool value_changed;
  float B;
  float G;
  float R;
  float V;
  float S;
  float H;
  ImVec2 triangle_pc;
  ImVec2 triangle_pb;
  ImVec2 triangle_pa;
  float triangle_r;
  ImVec2 wheel_center;
  float wheel_r_inner;
  float wheel_r_outer;
  float wheel_thickness;
  float backup_initial_col [4];
  float bars_triangles_half_sz;
  float bar1_pos_x;
  float bar0_pos_x;
  float sv_picker_size;
  float bars_width;
  float square_sz;
  ImVec2 picker_pos;
  bool alpha_bar;
  int components;
  float width;
  ImGuiIO *io;
  ImGuiStyle *style;
  ImDrawList *draw_list;
  ImGuiWindow *window;
  ImGuiContext *g;
  float *ref_col_local;
  ImGuiColorEditFlags flags_local;
  float *col_local;
  char *label_local;
  
  pIVar1 = GImGui;
  pIVar4 = GetCurrentWindow();
  if ((pIVar4->SkipItems & 1U) != 0) {
    return false;
  }
  this = pIVar4->DrawList;
  fVar5 = CalcItemWidth();
  ImGuiNextItemData::ClearFlags(&pIVar1->NextItemData);
  PushID(label);
  BeginGroup();
  ref_col_local._4_4_ = flags;
  if ((flags & 0x100U) == 0) {
    ref_col_local._4_4_ = flags | 0x10;
  }
  if ((ref_col_local._4_4_ & 8) == 0) {
    ColorPickerOptionsPopup(col,ref_col_local._4_4_);
  }
  if ((ref_col_local._4_4_ & 0x6000000) == 0) {
    if ((pIVar1->ColorEditOptions & 0x6000000U) == 0) {
      local_36c = 0xa900000;
    }
    else {
      local_36c = pIVar1->ColorEditOptions;
    }
    ref_col_local._4_4_ = local_36c & 0x6000000 | ref_col_local._4_4_;
  }
  if ((ref_col_local._4_4_ & 0x18000000) == 0) {
    if ((pIVar1->ColorEditOptions & 0x18000000U) == 0) {
      local_370 = 0xa900000;
    }
    else {
      local_370 = pIVar1->ColorEditOptions;
    }
    ref_col_local._4_4_ = local_370 & 0x18000000 | ref_col_local._4_4_;
  }
  bVar2 = ImIsPowerOfTwo(ref_col_local._4_4_ & 0x6000000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x115d,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  bVar2 = ImIsPowerOfTwo(ref_col_local._4_4_ & 0x18000000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x115e,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((ref_col_local._4_4_ & 8) == 0) {
    ref_col_local._4_4_ = pIVar1->ColorEditOptions & 0x10000U | ref_col_local._4_4_;
  }
  picker_pos.y = 5.60519e-45;
  if ((ref_col_local._4_4_ & 2) != 0) {
    picker_pos.y = 4.2039e-45;
  }
  local_371 = 0;
  if ((ref_col_local._4_4_ & 0x10000) != 0) {
    local_371 = (ref_col_local._4_4_ & 2) != 0 ^ 0xff;
  }
  picker_pos.x._3_1_ = local_371 & 1;
  _bars_width = (pIVar4->DC).CursorPos;
  _x = GetFrameHeight();
  iVar3 = 1;
  if ((picker_pos.x._3_1_ & 1) != 0) {
    iVar3 = 2;
  }
  fVar5 = ImMax<float>(_x * 1.0,-(float)iVar3 * (_x + (pIVar1->Style).ItemInnerSpacing.x) + fVar5);
  fVar6 = bars_width + fVar5 + (pIVar1->Style).ItemInnerSpacing.x;
  _x_00 = fVar6 + _x + (pIVar1->Style).ItemInnerSpacing.x;
  backup_initial_col[3] = (float)(int)(_x * 0.2);
  memcpy(&wheel_r_outer,col,(long)(int)picker_pos.y << 2);
  local_40c = fVar5 * 0.08;
  fVar7 = fVar5 * 0.5;
  fVar8 = fVar7 - local_40c;
  ImVec2::ImVec2((ImVec2 *)&triangle_pa.y,(fVar5 + _x) * 0.5 + bars_width,fVar5 * 0.5 + square_sz);
  triangle_pa.x = fVar8 - (float)(int)(fVar5 * 0.027);
  ImVec2::ImVec2(&triangle_pb,triangle_pa.x,0.0);
  ImVec2::ImVec2(&triangle_pc,triangle_pa.x * -0.5,triangle_pa.x * -0.866025);
  ImVec2::ImVec2((ImVec2 *)&S,triangle_pa.x * -0.5,triangle_pa.x * 0.866025);
  V = *col;
  R = col[1];
  G = col[2];
  B = *col;
  fStack_dc = col[1];
  local_e0 = col[2];
  if ((ref_col_local._4_4_ & 0x8000000) == 0) {
    if ((ref_col_local._4_4_ & 0x10000000) != 0) {
      ColorConvertHSVtoRGB(V,R,G,&B,&stack0xffffffffffffff24,&local_e0);
    }
  }
  else {
    ColorConvertRGBtoHSV(B,fStack_dc,local_e0,&V,&R,&G);
  }
  local_e1 = false;
  local_e2 = false;
  local_e3 = false;
  PushItemFlag(8,true);
  if ((ref_col_local._4_4_ & 0x4000000) == 0) {
    if ((ref_col_local._4_4_ & 0x2000000) != 0) {
      ImVec2::ImVec2(&local_134,fVar5,fVar5);
      InvisibleButton("sv",&local_134);
      local_e3 = IsItemActive();
      if (local_e3) {
        R = ImSaturate(((pIVar1->IO).MousePos.x - bars_width) / (fVar5 - 1.0));
        fVar9 = ImSaturate(((pIVar1->IO).MousePos.y - square_sz) / (fVar5 - 1.0));
        G = 1.0 - fVar9;
      }
      if ((ref_col_local._4_4_ & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      ImVec2::ImVec2(&local_13c,fVar6,square_sz);
      SetCursorScreenPos(&local_13c);
      ImVec2::ImVec2(&local_144,_x,fVar5);
      InvisibleButton("hue",&local_144);
      local_e2 = IsItemActive();
      local_e1 = local_e3;
      if (local_e2) {
        V = ImSaturate(((pIVar1->IO).MousePos.y - square_sz) / (fVar5 - 1.0));
        local_e1 = true;
      }
    }
  }
  else {
    ImVec2::ImVec2(&initial_off,fVar5 + (pIVar1->Style).ItemInnerSpacing.x + _x,fVar5);
    InvisibleButton("hsv",&initial_off);
    bVar2 = IsItemActive();
    if (bVar2) {
      current_off = operator-((pIVar1->IO).MouseClickedPos,(ImVec2 *)&triangle_pa.y);
      _cos_hue_angle = operator-(&(pIVar1->IO).MousePos,(ImVec2 *)&triangle_pa.y);
      fVar9 = ImLengthSqr(&current_off);
      if (((fVar8 - 1.0) * (fVar8 - 1.0) <= fVar9) && (fVar9 <= (fVar7 + 1.0) * (fVar7 + 1.0))) {
        fVar9 = ImAtan2(initial_dist2,cos_hue_angle);
        V = (fVar9 / 3.1415927) * 0.5;
        if (V < 0.0) {
          V = V + 1.0;
        }
        local_e2 = true;
        local_e1 = true;
      }
      fVar9 = ImCos((-V - V) * 3.1415927);
      fVar10 = ImSin((-V - V) * 3.1415927);
      current_off_unrotated = ImRotate(&current_off,fVar9,fVar10);
      bVar2 = ImTriangleContainsPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&current_off_unrotated)
      ;
      if (bVar2) {
        local_118 = ImRotate((ImVec2 *)&cos_hue_angle,fVar9,fVar10);
        bVar2 = ImTriangleContainsPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_118);
        if (!bVar2) {
          _vv = ImTriangleClosestPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_118);
          local_118 = _vv;
        }
        ImTriangleBarycentricCoords
                  (&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_118,&ww,&local_128,&local_12c);
        G = ImClamp<float>(1.0 - local_128,0.0001,1.0);
        R = ImClamp<float>(ww / G,0.0001,1.0);
        local_e3 = true;
        local_e1 = true;
      }
    }
    if ((ref_col_local._4_4_ & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  if ((picker_pos.x._3_1_ & 1) != 0) {
    ImVec2::ImVec2(&local_14c,_x_00,square_sz);
    SetCursorScreenPos(&local_14c);
    ImVec2::ImVec2((ImVec2 *)((long)&label_display_end + 4),_x,fVar5);
    InvisibleButton("alpha",(ImVec2 *)((long)&label_display_end + 4));
    bVar2 = IsItemActive();
    if (bVar2) {
      fVar9 = ImSaturate(((pIVar1->IO).MousePos.y - square_sz) / (fVar5 - 1.0));
      col[3] = 1.0 - fVar9;
      local_e1 = true;
    }
  }
  PopItemFlag();
  if ((ref_col_local._4_4_ & 0x100) == 0) {
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if (((ref_col_local._4_4_ & 0x80) == 0) &&
     (col_v4._8_8_ = FindRenderedTextEnd(label,(char *)0x0), label != (char *)col_v4._8_8_)) {
    if ((ref_col_local._4_4_ & 0x100) != 0) {
      SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    }
    TextEx(label,(char *)col_v4._8_8_,0);
  }
  if ((ref_col_local._4_4_ & 0x100) == 0) {
    PushItemFlag(0x10,true);
    if ((ref_col_local._4_4_ & 2) == 0) {
      local_3a8 = col[3];
    }
    else {
      local_3a8 = 1.0;
    }
    ImVec4::ImVec4((ImVec4 *)local_170,*col,col[1],col[2],local_3a8);
    if ((ref_col_local._4_4_ & 0x80) != 0) {
      Text("Current");
    }
    ImVec2::ImVec2((ImVec2 *)&ref_col_v4.z,_x * 3.0,_x + _x);
    ColorButton("##current",(ImVec4 *)local_170,ref_col_local._4_4_ & 0x180e0040,
                (ImVec2)ref_col_v4._8_8_);
    if (ref_col != (float *)0x0) {
      Text("Original");
      if ((ref_col_local._4_4_ & 2) == 0) {
        local_3bc = ref_col[3];
      }
      else {
        local_3bc = 1.0;
      }
      ImVec4::ImVec4((ImVec4 *)local_18c,*ref_col,ref_col[1],ref_col[2],local_3bc);
      ImVec2::ImVec2((ImVec2 *)&sub_flags_to_forward_1,_x * 3.0,_x + _x);
      bVar2 = ColorButton("##original",(ImVec4 *)local_18c,ref_col_local._4_4_ & 0x180e0040,
                          _sub_flags_to_forward_1);
      if (bVar2) {
        memcpy(col,ref_col,(long)(int)picker_pos.y << 2);
        local_e1 = true;
      }
    }
    PopItemFlag();
    EndGroup();
  }
  if ((local_e2 != false) || (local_e3 != false)) {
    if ((ref_col_local._4_4_ & 0x8000000) == 0) {
      if ((ref_col_local._4_4_ & 0x10000000) != 0) {
        *col = V;
        col[1] = R;
        col[2] = G;
      }
    }
    else {
      if (V < 1.0) {
        local_3c4 = V;
      }
      else {
        local_3c4 = V - 1e-05;
      }
      if (R <= 0.0) {
        local_3cc = 1e-05;
      }
      else {
        local_3cc = R;
      }
      if (G <= 0.0) {
        local_3d4 = 1e-06;
      }
      else {
        local_3d4 = G;
      }
      ColorConvertHSVtoRGB(local_3c4,local_3cc,local_3d4,col,col + 1,col + 2);
    }
  }
  sub_flags._3_1_ = 0;
  if ((ref_col_local._4_4_ & 0x20) == 0) {
    local_3d8 = fVar6;
    if ((picker_pos.x._3_1_ & 1) != 0) {
      local_3d8 = _x_00;
    }
    PushItemWidth((local_3d8 + _x) - bars_width);
    new_H = 1.4682497e-23;
    new_S = (float)(ref_col_local._4_4_ & 0x198e001a | 4);
    if ((((ref_col_local._4_4_ & 0x100000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) &&
       (bVar2 = ColorEdit4("##rgb",col,ref_col_local._4_4_ & 0x198e001a | 0x100004), bVar2)) {
      local_3d9 = 0;
      if (pIVar1->ActiveId != 0) {
        local_3d9 = pIVar1->ActiveIdAllowOverlap ^ 0xff;
      }
      sub_flags._3_1_ = local_3d9 & 1;
      local_e1 = true;
    }
    if (((ref_col_local._4_4_ & 0x200000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) {
      bVar2 = ColorEdit4("##hsv",col,(uint)new_S | 0x200000);
      local_e1 = local_e1 != false || bVar2;
    }
    if (((ref_col_local._4_4_ & 0x400000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) {
      bVar2 = ColorEdit4("##hex",col,(uint)new_S | 0x400000);
      local_e1 = local_e1 != false || bVar2;
    }
    PopItemWidth();
  }
  if (((((sub_flags._3_1_ & 1) != 0) && ((ref_col_local._4_4_ & 0x8000000) != 0)) &&
      (ColorConvertRGBtoHSV(*col,col[1],col[2],&new_V,&hue_color_f.w,&hue_color_f.z), new_V <= 0.0))
     && (0.0 < V)) {
    if (hue_color_f.z <= 0.0) {
      if ((G != hue_color_f.z) || (NAN(G) || NAN(hue_color_f.z))) {
        if (0.0 < hue_color_f.z) {
          local_3e8 = hue_color_f.z;
        }
        else {
          local_3e8 = G * 0.5;
        }
        ColorConvertHSVtoRGB(V,R,local_3e8,col,col + 1,col + 2);
        goto LAB_001c5866;
      }
    }
    if (hue_color_f.w <= 0.0) {
      if (0.0 < hue_color_f.w) {
        local_3f0 = hue_color_f.w;
      }
      else {
        local_3f0 = R * 0.5;
      }
      ColorConvertHSVtoRGB(V,local_3f0,hue_color_f.z,col,col + 1,col + 2);
    }
  }
LAB_001c5866:
  if (local_e1 != false) {
    if ((ref_col_local._4_4_ & 0x8000000) == 0) {
      if ((ref_col_local._4_4_ & 0x10000000) != 0) {
        V = *col;
        R = col[1];
        G = col[2];
        ColorConvertHSVtoRGB(V,R,G,&B,&stack0xffffffffffffff24,&local_e0);
      }
    }
    else {
      B = *col;
      fStack_dc = col[1];
      local_e0 = col[2];
      ColorConvertRGBtoHSV(B,fStack_dc,local_e0,&V,&R,&G);
    }
  }
  ImVec4::ImVec4((ImVec4 *)&col32_no_alpha,1.0,1.0,1.0,1.0);
  ColorConvertHSVtoRGB(V,1.0,1.0,(float *)&col32_no_alpha,(float *)&hue_color32,&hue_color_f.x);
  local_1c0 = ColorConvertFloat4ToU32((ImVec4 *)&col32_no_alpha);
  ImVec4::ImVec4(&local_1d4,B,fStack_dc,local_e0,1.0);
  local_1c4 = ColorConvertFloat4ToU32(&local_1d4);
  sv_cursor_pos.x = -1.7014636e+38;
  sv_cursor_pos.y = -1.714704e+38;
  ImVec2::ImVec2((ImVec2 *)&segment_per_arc);
  if ((ref_col_local._4_4_ & 0x4000000) == 0) {
    if ((ref_col_local._4_4_ & 0x2000000) != 0) {
      ImVec2::ImVec2(&local_2b0,fVar5,fVar5);
      local_2a8 = operator+((ImVec2 *)&bars_width,&local_2b0);
      ImDrawList::AddRectFilledMultiColor
                (this,(ImVec2 *)&bars_width,&local_2a8,0xffffffff,local_1c0,local_1c0,0xffffffff);
      ImVec2::ImVec2(&local_2c0,fVar5,fVar5);
      local_2b8 = operator+((ImVec2 *)&bars_width,&local_2c0);
      ImDrawList::AddRectFilledMultiColor
                (this,(ImVec2 *)&bars_width,&local_2b8,0,0,0xff000000,0xff000000);
      local_2c8 = _bars_width;
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd28,fVar5,fVar5);
      local_2d0 = operator+((ImVec2 *)&bars_width,(ImVec2 *)&stack0xfffffffffffffd28);
      RenderFrameBorder(local_2c8,local_2d0,0.0);
      fVar7 = bars_width;
      fVar8 = ImSaturate(R);
      segment_per_arc =
           (int)ImClamp<float>((float)(int)(fVar8 * fVar5 + fVar7 + 0.5),bars_width + 2.0,
                               (bars_width + fVar5) - 2.0);
      fVar7 = square_sz;
      fVar8 = ImSaturate(1.0 - G);
      fVar7 = ImClamp<float>((float)(int)(fVar8 * fVar5 + fVar7 + 0.5),square_sz + 2.0,
                             (square_sz + fVar5) - 2.0);
      aeps = fVar7;
      for (local_2dc = 0; local_2dc < 6; local_2dc = local_2dc + 1) {
        ImVec2::ImVec2(&local_2e4,fVar6,(float)local_2dc * (fVar5 / 6.0) + square_sz);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd14,fVar6 + _x,
                       (float)(local_2dc + 1) * (fVar5 / 6.0) + square_sz);
        ImDrawList::AddRectFilledMultiColor
                  (this,&local_2e4,(ImVec2 *)&stack0xfffffffffffffd14,
                   hue_colors[(long)local_2dc + -2],hue_colors[(long)local_2dc + -2],
                   hue_colors[(long)(local_2dc + 1) + -2],hue_colors[(long)(local_2dc + 1) + -2]);
      }
      local_2f0 = (float)(int)(V * fVar5 + square_sz + 0.5);
      ImVec2::ImVec2(&local_2f8,fVar6,square_sz);
      ImVec2::ImVec2(&local_300,fVar6 + _x,square_sz + fVar5);
      RenderFrameBorder(local_2f8,local_300,0.0);
      ImVec2::ImVec2(&local_308,fVar6 - 1.0,local_2f0);
      ImVec2::ImVec2((ImVec2 *)&alpha,backup_initial_col[3] + 1.0,backup_initial_col[3]);
      RenderArrowsForVerticalBar(this,local_308,_alpha,_x + 2.0);
    }
  }
  else {
    iVar3 = ImMax<int>(4,(int)fVar7 / 0xc);
    for (a1 = 0.0; (int)a1 < 6; a1 = (float)((int)a1 + 1)) {
      fVar9 = ((float)(int)a1 / 6.0 + (float)(int)a1 / 6.0) * 3.1415927 - 1.5 / fVar7;
      fVar6 = ((float)(int)a1 + 1.0) / 6.0;
      fVar10 = (fVar6 + fVar6) * 3.1415927 + 1.5 / fVar7;
      vert_start_idx_00 = (this->VtxBuffer).Size;
      ImDrawList::PathArcTo(this,(ImVec2 *)&triangle_pa.y,(fVar8 + fVar7) * 0.5,fVar9,fVar10,iVar3);
      ImDrawList::PathStroke(this,0xffffffff,false,local_40c);
      fVar6 = triangle_pa.y;
      vert_end_idx_00 = (this->VtxBuffer).Size;
      fVar11 = ImCos(fVar9);
      fVar9 = ImSin(fVar9);
      ImVec2::ImVec2(&gradient_p1,fVar11 * fVar8 + fVar6,fVar9 * fVar8 + triangle_r);
      fVar6 = triangle_pa.y;
      fVar9 = ImCos(fVar10);
      fVar10 = ImSin(fVar10);
      ImVec2::ImVec2(&local_22c,fVar9 * fVar8 + fVar6,fVar10 * fVar8 + triangle_r);
      ShadeVertsLinearColorGradientKeepAlpha
                (this,vert_start_idx_00,vert_end_idx_00,gradient_p1,local_22c,
                 hue_colors[(long)(int)a1 + -2],hue_colors[(long)(int)a1 + -1]);
    }
    hue_cursor_pos.y = ImCos(V * 2.0 * 3.1415927);
    hue_cursor_pos.x = ImSin(V * 2.0 * 3.1415927);
    ImVec2::ImVec2((ImVec2 *)&hue_cursor_segments,
                   hue_cursor_pos.y * (fVar8 + fVar7) * 0.5 + triangle_pa.y,
                   hue_cursor_pos.x * (fVar8 + fVar7) * 0.5 + triangle_r);
    if (local_e2 == false) {
      local_40c = local_40c * 0.55;
    }
    else {
      local_40c = local_40c * 0.65;
    }
    tra.y = local_40c;
    tra.x = (float)ImClamp<int>((int)(local_40c / 1.4),9,0x20);
    ImDrawList::AddCircleFilled(this,(ImVec2 *)&hue_cursor_segments,tra.y,local_1c0,(int)tra.x);
    ImDrawList::AddCircle(this,(ImVec2 *)&hue_cursor_segments,tra.y + 1.0,0xff808080,(int)tra.x,1.0)
    ;
    ImDrawList::AddCircle(this,(ImVec2 *)&hue_cursor_segments,tra.y,0xffffffff,(int)tra.x,1.0);
    trb = ImRotate(&triangle_pb,hue_cursor_pos.y,hue_cursor_pos.x);
    lhs = &triangle_pa.y;
    local_260 = operator+((ImVec2 *)lhs,&trb);
    trc = ImRotate(&triangle_pc,hue_cursor_pos.y,hue_cursor_pos.x);
    local_270 = operator+((ImVec2 *)lhs,&trc);
    uv_white = ImRotate((ImVec2 *)&S,hue_cursor_pos.y,hue_cursor_pos.x);
    local_280 = operator+((ImVec2 *)lhs,&uv_white);
    local_290 = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(this,6,6);
    ImDrawList::PrimVtx(this,&local_260,&local_290,local_1c0);
    ImDrawList::PrimVtx(this,&local_270,&local_290,local_1c0);
    ImDrawList::PrimVtx(this,&local_280,&local_290,0xffffffff);
    ImDrawList::PrimVtx(this,&local_260,&local_290,0);
    ImDrawList::PrimVtx(this,&local_270,&local_290,0xff000000);
    ImDrawList::PrimVtx(this,&local_280,&local_290,0);
    ImDrawList::AddTriangle(this,&local_260,&local_270,&local_280,0xff808080,1.5);
    fVar6 = ImSaturate(R);
    local_2a0 = ImLerp(&local_280,&local_260,fVar6);
    fVar6 = ImSaturate(1.0 - G);
    local_298 = ImLerp(&local_2a0,&local_270,fVar6);
    _segment_per_arc = local_298;
  }
  local_4a8 = 10.0;
  if (local_e3 == false) {
    local_4a8 = 6.0;
  }
  bar1_bb.Max.y = local_4a8;
  ImDrawList::AddCircleFilled(this,(ImVec2 *)&segment_per_arc,local_4a8,local_1c4,0xc);
  ImDrawList::AddCircle(this,(ImVec2 *)&segment_per_arc,bar1_bb.Max.y + 1.0,0xff808080,0xc,1.0);
  ImDrawList::AddCircle(this,(ImVec2 *)&segment_per_arc,bar1_bb.Max.y,0xffffffff,0xc,1.0);
  if ((picker_pos.x._3_1_ & 1) != 0) {
    bar1_bb.Max.x = ImSaturate(col[3]);
    ImRect::ImRect((ImRect *)local_328,_x_00,square_sz,_x_00 + _x,square_sz + fVar5);
    local_330.x = (float)local_328._0_4_;
    local_330.y = (float)local_328._4_4_;
    local_338 = bar1_bb.Min;
    fVar6 = ImRect::GetWidth((ImRect *)local_328);
    ImVec2::ImVec2(&stack0xfffffffffffffcc0,0.0,0.0);
    RenderColorRectWithAlphaCheckerboard(local_330,local_338,0,fVar6 * 0.5,IStack_340,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_328,&bar1_bb.Min,local_1c4,local_1c4,local_1c4 & 0xffffff,
               local_1c4 & 0xffffff);
    local_344 = (float)(int)((1.0 - bar1_bb.Max.x) * fVar5 + square_sz + 0.5);
    local_350.x = (float)local_328._0_4_;
    local_350.y = (float)local_328._4_4_;
    local_358 = bar1_bb.Min;
    RenderFrameBorder((ImVec2)local_328,bar1_bb.Min,0.0);
    ImVec2::ImVec2(&local_360,_x_00 - 1.0,local_344);
    ImVec2::ImVec2(&local_368,backup_initial_col[3] + 1.0,backup_initial_col[3]);
    RenderArrowsForVerticalBar(this,local_360,local_368,_x + 2.0);
  }
  EndGroup();
  if ((local_e1 != false) &&
     (iVar3 = memcmp(&wheel_r_outer,col,(long)(int)picker_pos.y << 2), iVar3 == 0)) {
    local_e1 = false;
  }
  if (local_e1 != false) {
    MarkItemEdited((pIVar4->DC).LastItemId);
  }
  PopID();
  return local_e1;
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
    else if (flags & ImGuiColorEditFlags_InputHSV)
        ColorConvertHSVtoRGB(H, S, V, R, G, B);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}